

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEseqFloatVisitor.cpp
# Opt level: O1

void __thiscall IRT::CEseqFloatVisitor::Visit(CEseqFloatVisitor *this,CCallExpression *expression)

{
  pointer puVar1;
  CStatement *pCVar2;
  CExpression *pCVar3;
  undefined8 uVar4;
  CExpressionList *pCVar5;
  vector<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
  *pvVar6;
  CSeqStatement *this_00;
  CEseqExpression *this_01;
  CCallExpression *pCVar7;
  pointer *__ptr;
  CEseqFloatVisitor *this_02;
  CSeqStatement *pCVar8;
  CEseqFloatVisitor *this_03;
  int i;
  ulong uVar9;
  vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
  helpStatements;
  undefined1 local_a0 [24];
  undefined1 local_88 [24];
  undefined1 local_70 [16];
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_60;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_58;
  _Head_base<0UL,_const_IRT::CExpressionList_*,_false> local_50;
  _Head_base<0UL,_const_IRT::CNameExpression_*,_false> local_48;
  CEseqFloatVisitor *local_40;
  CCallExpression *local_38;
  
  pCVar5 = CCallExpression::getArguments(expression);
  (**(pCVar5->super_IExpression).super_INode._vptr_INode)(pCVar5);
  this_02 = (CEseqFloatVisitor *)
            (this->childExpressionList)._M_t.
            super___uniq_ptr_impl<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>
            ._M_t.
            super__Tuple_impl<0UL,_const_IRT::CExpressionList_*,_std::default_delete<const_IRT::CExpressionList>_>
            .super__Head_base<0UL,_const_IRT::CExpressionList_*,_false>._M_head_impl;
  (this->childExpressionList)._M_t.
  super___uniq_ptr_impl<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpressionList_*,_std::default_delete<const_IRT::CExpressionList>_>
  .super__Head_base<0UL,_const_IRT::CExpressionList_*,_false>._M_head_impl = (CExpressionList *)0x0;
  pvVar6 = CExpressionList::getExpressions((CExpressionList *)this_02);
  if ((pvVar6->
      super__Vector_base<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (pvVar6->
      super__Vector_base<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    pCVar7 = (CCallExpression *)operator_new(0x18);
    CCallExpression::getFunction(expression);
    CNameExpression::CopyCast((CNameExpression *)local_88);
    local_48._M_head_impl = (CNameExpression *)local_88._0_8_;
    local_88._0_8_ = (pointer)0x0;
    local_50._M_head_impl = (CExpressionList *)this_02;
    CCallExpression::CCallExpression
              (pCVar7,(unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_>
                       *)&local_48,
               (unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>
                *)&local_50);
    pCVar3 = (this->childExpression)._M_t.
             super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
             .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
    (this->childExpression)._M_t.
    super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t
    .super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
    super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = (CExpression *)pCVar7;
    if (pCVar3 != (CExpression *)0x0) {
      (**(code **)((long)(pCVar3->super_IExpression).super_INode + 0x10))();
    }
    if ((CEseqFloatVisitor *)local_50._M_head_impl != (CEseqFloatVisitor *)0x0) {
      (*((INode *)&((IVisitor *)&(local_50._M_head_impl)->super_IExpression)->_vptr_IVisitor)->
        _vptr_INode[2])();
    }
    local_50._M_head_impl = (CExpressionList *)0x0;
    if (local_48._M_head_impl != (CNameExpression *)0x0) {
      (*(code *)*(IStatement *)
                 &(((__uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                     *)&((local_48._M_head_impl)->super_CExpression).super_IExpression)->_M_t).
                  super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
                  .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl[2].
                  super_IStatement.super_INode)();
    }
    local_48._M_head_impl = (CNameExpression *)0x0;
    if ((pointer)local_88._0_8_ != (pointer)0x0) {
      (**(code **)((long)*(__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
                           *)local_88._0_8_ + 0x10))();
    }
    this_02 = (CEseqFloatVisitor *)0x0;
  }
  else {
    local_88._0_8_ = (pointer)0x0;
    local_88._8_8_ = (pointer)0x0;
    local_88._16_8_ = (pointer)0x0;
    pCVar5 = (CExpressionList *)operator_new(0x20);
    local_38 = expression;
    CExpressionList::CExpressionList(pCVar5,(CExpression *)0x0);
    uVar9 = 0;
    while( true ) {
      pvVar6 = CExpressionList::getExpressions((CExpressionList *)this_02);
      if ((ulong)((long)(pvVar6->
                        super__Vector_base<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pvVar6->
                        super__Vector_base<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar9) break;
      this_03 = this_02;
      pvVar6 = CExpressionList::getExpressions((CExpressionList *)this_02);
      processCallArgument(this_03,(CExpression *)
                                  (pvVar6->
                                  super__Vector_base<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start[uVar9]._M_t.
                                  super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                                  ._M_t,pCVar5,
                          (vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
                           *)local_88);
      uVar9 = uVar9 + 1;
    }
    this_00 = (CSeqStatement *)
              (((pointer)(local_88._8_8_ + -8))->_M_t).
              super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
              ._M_t.
              super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
              .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl;
    (((pointer)(local_88._8_8_ + -8))->_M_t).
    super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t.
    super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
    super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl = (CStatement *)0x0;
    puVar1 = (pointer)(local_88._8_8_ + -8);
    pCVar2 = (((pointer)(local_88._8_8_ + -8))->_M_t).
             super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
             .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl;
    local_88._8_8_ = puVar1;
    if (pCVar2 != (CStatement *)0x0) {
      (**(code **)((long)(pCVar2->super_IStatement).super_INode + 0x10))();
    }
    (puVar1->_M_t).
    super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t.
    super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
    super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl = (CStatement *)0x0;
    local_40 = this;
    if (local_88._8_8_ != local_88._0_8_) {
      uVar9 = 0;
      pCVar8 = this_00;
      do {
        uVar4 = local_88._0_8_;
        this_00 = (CSeqStatement *)operator_new(0x18);
        local_58._M_head_impl =
             (((pointer)(uVar4 + uVar9 * 8))->_M_t).
             super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
             .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl;
        (((pointer)(uVar4 + uVar9 * 8))->_M_t).
        super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>.
        _M_t.
        super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
        .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl = (CStatement *)0x0;
        local_a0._16_8_ = pCVar8;
        CSeqStatement::CSeqStatement
                  (this_00,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                            *)&local_58,
                   (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *
                   )(local_a0 + 0x10));
        if ((CSeqStatement *)local_a0._16_8_ != (CSeqStatement *)0x0) {
          (*(((CStatement *)local_a0._16_8_)->super_IStatement).super_INode._vptr_INode[2])();
        }
        local_a0._16_8_ = 0;
        if (local_58._M_head_impl != (CStatement *)0x0) {
          (*((local_58._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
        }
        local_58._M_head_impl = (CStatement *)0x0;
        uVar9 = uVar9 + 1;
        pCVar8 = this_00;
      } while (uVar9 < (ulong)((long)(local_88._8_8_ - local_88._0_8_) >> 3));
    }
    this_01 = (CEseqExpression *)operator_new(0x18);
    local_a0._8_8_ = this_00;
    pCVar7 = (CCallExpression *)operator_new(0x18);
    CCallExpression::getFunction(local_38);
    CNameExpression::CopyCast((CNameExpression *)local_a0);
    local_70._8_8_ = local_a0._0_8_;
    local_a0._0_8_ = (_func_int **)0x0;
    local_70._0_8_ = pCVar5;
    CCallExpression::CCallExpression
              (pCVar7,(unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_>
                       *)(local_70 + 8),
               (unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>
                *)local_70);
    local_60._M_head_impl = (CExpression *)pCVar7;
    CEseqExpression::CEseqExpression
              (this_01,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                        *)(local_a0 + 8),
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &local_60);
    pCVar3 = (local_40->childExpression)._M_t.
             super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
             .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
    (local_40->childExpression)._M_t.
    super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t
    .super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
    super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = (CExpression *)this_01;
    if (pCVar3 != (CExpression *)0x0) {
      (**(code **)((long)(pCVar3->super_IExpression).super_INode + 0x10))();
    }
    if ((CCallExpression *)local_60._M_head_impl != (CCallExpression *)0x0) {
      (*(((CExpression *)&(local_60._M_head_impl)->super_IExpression)->super_IExpression).
        super_INode._vptr_INode[2])();
    }
    local_60._M_head_impl = (CExpression *)0x0;
    if ((CExpressionList *)local_70._0_8_ != (CExpressionList *)0x0) {
      (**(code **)(*(long *)local_70._0_8_ + 0x10))();
    }
    local_70._0_8_ = (CExpressionList *)0x0;
    if ((_func_int **)local_70._8_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_70._8_8_ + 0x10))();
    }
    local_70._8_8_ = 0;
    if ((_func_int **)local_a0._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_a0._0_8_ + 0x10))();
    }
    if ((CSeqStatement *)local_a0._8_8_ != (CSeqStatement *)0x0) {
      (**(code **)(*(long *)local_a0._8_8_ + 0x10))();
    }
    local_a0._8_8_ = (pointer)0x0;
    std::
    vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
    ::~vector((vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
               *)local_88);
  }
  if (this_02 != (CEseqFloatVisitor *)0x0) {
    (*((INode *)&(this_02->super_IVisitor)._vptr_IVisitor)->_vptr_INode[2])(this_02);
  }
  return;
}

Assistant:

void IRT::CEseqFloatVisitor::Visit(const IRT::CCallExpression &expression) {
    expression.getArguments()->Accept(*this);
    std::unique_ptr<const CExpressionList> args = std::move(childExpressionList);

    if (args->getExpressions().size() == 0) {
        childExpression = EMOVE_UNIQ(new CCallExpression(
                std::move(expression.getFunction()->CopyCast()),
                std::move(args)
        ));

        return;
    }

    std::vector<std::unique_ptr<const CStatement>> helpStatements;

    CExpressionList* tempExpressionList = new CExpressionList();

    for (int i = 0; i < args->getExpressions().size(); ++i) {
        processCallArgument(args->getExpressions()[i].get(), tempExpressionList, helpStatements);
    }

    std::unique_ptr<const CStatement> rightStatement = std::move(helpStatements.back());
    helpStatements.pop_back();
    for (int i = 0; i < helpStatements.size(); ++i) {
        rightStatement = SMOVE_UNIQ(new CSeqStatement(
                std::move(helpStatements[i]),
                std::move(rightStatement)
        ));
    }

    childExpression = EMOVE_UNIQ(new CEseqExpression(
            std::move(rightStatement),
            EMOVE_UNIQ(new CCallExpression(
                    std::move(expression.getFunction()->CopyCast()),
                    std::move(std::unique_ptr<const CExpressionList>(tempExpressionList))
            ))
    ));
}